

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_diag_sse41_128_16.c
# Opt level: O2

parasail_result_t *
parasail_sw_stats_diag_sse41_128_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int *piVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  short sVar5;
  bool bVar6;
  short sVar7;
  bool bVar8;
  short sVar9;
  bool bVar10;
  short sVar11;
  short sVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  uint uVar18;
  undefined2 uVar19;
  parasail_result_t *ppVar20;
  int16_t *ptr;
  undefined4 uVar21;
  undefined4 uVar22;
  int iVar23;
  int16_t *ptr_00;
  int16_t *ptr_01;
  int16_t *ptr_02;
  int16_t *ptr_03;
  int16_t *ptr_04;
  int16_t *ptr_05;
  int16_t *ptr_06;
  int16_t *ptr_07;
  int16_t *ptr_08;
  short sVar24;
  uint uVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  char *pcVar29;
  short sVar30;
  uint uVar31;
  uint uVar33;
  uint uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  int16_t iVar38;
  uint uVar39;
  char *__format;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  int iVar43;
  uint uVar44;
  undefined4 uVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  short sVar54;
  undefined1 auVar52 [16];
  ushort uVar60;
  ushort uVar62;
  ushort uVar63;
  ushort uVar64;
  ushort uVar65;
  ushort uVar66;
  ushort uVar67;
  ushort uVar68;
  undefined1 auVar61 [16];
  short sVar69;
  short sVar71;
  short sVar72;
  undefined8 uVar70;
  short sVar73;
  short sVar74;
  short sVar76;
  short sVar77;
  ulong uVar75;
  short sVar78;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  short sVar83;
  ushort uVar84;
  ushort uVar85;
  short sVar89;
  short sVar91;
  short sVar93;
  short sVar95;
  short sVar97;
  short sVar99;
  undefined1 auVar86 [16];
  ushort uVar90;
  ushort uVar92;
  ushort uVar94;
  ushort uVar96;
  ushort uVar98;
  ushort uVar100;
  short sVar101;
  ushort uVar102;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar103 [16];
  undefined1 auVar105 [16];
  undefined8 uVar113;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  uint local_30c;
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  short local_288;
  short sStack_286;
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [4];
  short sStack_234;
  short sStack_232;
  short sStack_230;
  short sStack_22e;
  short sStack_22c;
  short sStack_22a;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined8 local_148;
  undefined8 uStack_140;
  parasail_result_t *local_130;
  int16_t *local_128;
  ulong local_120;
  short local_118;
  short sStack_116;
  short sStack_114;
  short sStack_112;
  short sStack_110;
  short sStack_10e;
  short sStack_10c;
  short sStack_10a;
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined1 local_f8 [16];
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  short local_b8;
  short sStack_b6;
  short sStack_b4;
  short sStack_b2;
  short sStack_b0;
  short sStack_ae;
  short sStack_ac;
  short sStack_aa;
  undefined1 local_a8 [16];
  undefined8 local_98;
  ulong uStack_90;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  ushort local_48;
  ushort uStack_46;
  ushort uStack_44;
  ushort uStack_42;
  ushort uStack_40;
  ushort uStack_3e;
  ushort uStack_3c;
  ushort uStack_3a;
  int iVar32;
  short sVar45;
  short sVar53;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  short sVar59;
  short sVar104;
  short sVar106;
  short sVar107;
  short sVar108;
  short sVar109;
  short sVar110;
  short sVar111;
  short sVar112;
  
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar29 = "_s2";
LAB_00641eb3:
    fprintf(_stderr,__format,"parasail_sw_stats_diag_sse41_128_16",pcVar29);
    return (parasail_result_t *)0x0;
  }
  uVar36 = (ulong)(uint)s2Len;
  if (s2Len < 1) {
    __format = "%s: %s must be > 0\n";
    pcVar29 = "s2Len";
    goto LAB_00641eb3;
  }
  if (open < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar29 = "open";
    goto LAB_00641eb3;
  }
  if (gap < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar29 = "gap";
    goto LAB_00641eb3;
  }
  uVar35 = (ulong)(uint)_s1Len;
  if (matrix == (parasail_matrix_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar29 = "matrix";
    goto LAB_00641eb3;
  }
  if (matrix->type == 1) {
    if (_s1 == (char *)0x0) {
      fprintf(_stderr,"%s: stats functions with pssm require a consensus sequence\n",
              "parasail_sw_stats_diag_sse41_128_16");
      return (parasail_result_t *)0x0;
    }
  }
  else {
    if (_s1 == (char *)0x0) {
      __format = "%s: missing %s\n";
      pcVar29 = "_s1";
      goto LAB_00641eb3;
    }
    if (_s1Len < 1) {
      __format = "%s: %s must be > 0\n";
      pcVar29 = "_s1Len";
      goto LAB_00641eb3;
    }
    if (matrix->type == 0) goto LAB_00640ea4;
  }
  uVar35 = (ulong)(uint)matrix->length;
LAB_00640ea4:
  iVar23 = -open;
  iVar43 = matrix->min;
  iVar32 = -iVar43;
  if (iVar43 != iVar23 && SBORROW4(iVar43,iVar23) == iVar43 + open < 0) {
    iVar32 = open;
  }
  uVar31 = iVar32 - 0x7fff;
  iVar43 = matrix->max;
  auVar47 = pshuflw(ZEXT416(uVar31),ZEXT416(uVar31),0);
  uVar46 = auVar47._0_4_;
  local_148 = CONCAT44(uVar46,uVar46);
  uStack_140 = CONCAT44(uVar46,uVar46);
  local_1e8 = CONCAT44(uVar46,uVar46);
  uStack_1e0 = CONCAT44(uVar46,uVar46);
  local_1f8 = CONCAT44(uVar46,uVar46);
  uStack_1f0 = CONCAT44(uVar46,uVar46);
  local_208 = CONCAT44(uVar46,uVar46);
  uStack_200 = CONCAT44(uVar46,uVar46);
  local_218 = CONCAT44(uVar46,uVar46);
  uStack_210 = CONCAT44(uVar46,uVar46);
  local_288 = auVar47._0_2_;
  sStack_286 = auVar47._2_2_;
  local_228 = CONCAT44(uVar46,uVar46);
  uStack_220 = CONCAT44(uVar46,uVar46);
  local_130 = parasail_result_new_stats();
  if (local_130 != (parasail_result_t *)0x0) {
    uVar25 = (uint)uVar35;
    local_130->flag = local_130->flag | 0x8211004;
    ptr_00 = parasail_memalign_int16_t(0x10,(long)(int)(uVar25 + 7));
    uVar26 = (ulong)(s2Len + 0xe);
    ptr_01 = parasail_memalign_int16_t(0x10,uVar26);
    ptr_02 = parasail_memalign_int16_t(0x10,uVar26);
    ptr_03 = parasail_memalign_int16_t(0x10,uVar26);
    ptr_04 = parasail_memalign_int16_t(0x10,uVar26);
    local_128 = parasail_memalign_int16_t(0x10,uVar26);
    ptr_05 = parasail_memalign_int16_t(0x10,uVar26);
    ptr_06 = parasail_memalign_int16_t(0x10,uVar26);
    ptr_07 = parasail_memalign_int16_t(0x10,uVar26);
    ptr_08 = parasail_memalign_int16_t(0x10,uVar26);
    ptr = local_128;
    ppVar20 = local_130;
    auVar79._0_8_ = -(ulong)(ptr_00 == (int16_t *)0x0);
    auVar79._8_8_ = -(ulong)(ptr_01 == (int16_t *)0x0);
    auVar80._0_8_ = -(ulong)(ptr_02 == (int16_t *)0x0);
    auVar80._8_8_ = -(ulong)(ptr_03 == (int16_t *)0x0);
    auVar80 = packssdw(auVar79,auVar80);
    auVar48._0_8_ = -(ulong)(ptr_04 == (int16_t *)0x0);
    auVar48._8_8_ = -(ulong)(local_128 == (int16_t *)0x0);
    auVar47._0_8_ = -(ulong)(ptr_05 == (int16_t *)0x0);
    auVar47._8_8_ = -(ulong)(ptr_06 == (int16_t *)0x0);
    auVar47 = packssdw(auVar48,auVar47);
    auVar47 = packssdw(auVar80,auVar47);
    uVar26 = 0;
    if ((ptr_08 != (int16_t *)0x0 && ptr_07 != (int16_t *)0x0) &&
        ((((((((((((((((auVar47 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                      (auVar47 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar47 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar47 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar47 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar47 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar47 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar47 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar47 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar47 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar47 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar47 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar47 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar47 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar47 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar47[0xf]))
    {
      uVar33 = s2Len + 7;
      auVar47 = ZEXT416(CONCAT22((short)((uint)iVar23 >> 0x10),0x7ffe - (short)iVar43));
      auVar47 = pshuflw(auVar47,auVar47,0);
      local_118 = auVar47._0_2_;
      sStack_116 = auVar47._2_2_;
      auVar49._4_2_ = local_288;
      auVar49._0_4_ = uVar46;
      auVar49._6_2_ = sStack_286;
      auVar49._8_2_ = local_288;
      auVar49._10_2_ = sStack_286;
      auVar49._12_2_ = local_288;
      auVar49._14_2_ = sStack_286;
      local_f8 = pblendw((undefined1  [16])0x0,auVar49,0x7f);
      auVar48 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
      local_c8 = auVar48._0_4_;
      uStack_c4 = local_c8;
      uStack_c0 = local_c8;
      uStack_bc = local_c8;
      auVar48 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
      local_d8 = auVar48._0_4_;
      uStack_d4 = local_d8;
      uStack_d0 = local_d8;
      uStack_cc = local_d8;
      auVar48 = pshuflw(ZEXT416(uVar25),ZEXT416(uVar25),0);
      local_108 = auVar48._0_4_;
      uVar21 = local_108;
      uStack_104 = local_108;
      uStack_100 = local_108;
      uStack_fc = local_108;
      auVar80 = pshuflw(ZEXT416((uint)s2Len),ZEXT416((uint)s2Len),0);
      local_e8 = auVar80._0_4_;
      uVar22 = local_e8;
      uStack_e4 = local_e8;
      uStack_e0 = local_e8;
      uStack_dc = local_e8;
      uVar75 = 0;
      if (0 < (int)uVar25) {
        uVar75 = uVar35;
      }
      for (; uVar75 != uVar26; uVar26 = uVar26 + 1) {
        ptr_00[uVar26] = (int16_t)matrix->mapper[(byte)_s1[uVar26]];
      }
      lVar27 = (long)(int)uVar25;
      for (lVar28 = lVar27; lVar28 < (int)(uVar25 + 7); lVar28 = lVar28 + 1) {
        ptr_00[lVar28] = 0;
      }
      piVar1 = matrix->mapper;
      for (uVar35 = 0; uVar36 != uVar35; uVar35 = uVar35 + 1) {
        ptr_01[uVar35 + 7] = (int16_t)piVar1[(byte)_s2[uVar35]];
      }
      for (lVar28 = 0; uVar35 = uVar36, lVar28 != 7; lVar28 = lVar28 + 1) {
        ptr_01[lVar28] = 0;
      }
      for (; (int)uVar35 < (int)uVar33; uVar35 = uVar35 + 1) {
        ptr_01[uVar35 + 7] = 0;
      }
      for (lVar28 = 0; iVar38 = (int16_t)uVar31, uVar36 * 2 != lVar28; lVar28 = lVar28 + 2) {
        *(undefined2 *)((long)ptr_02 + lVar28 + 0xe) = 0;
        *(undefined2 *)((long)ptr_03 + lVar28 + 0xe) = 0;
        *(undefined2 *)((long)ptr_04 + lVar28 + 0xe) = 0;
        *(undefined2 *)((long)local_128 + lVar28 + 0xe) = 0;
        *(int16_t *)((long)ptr_05 + lVar28 + 0xe) = iVar38;
        *(undefined2 *)((long)ptr_06 + lVar28 + 0xe) = 0;
        *(undefined2 *)((long)ptr_07 + lVar28 + 0xe) = 0;
        *(undefined2 *)((long)ptr_08 + lVar28 + 0xe) = 0;
      }
      for (lVar28 = 0; lVar28 != 0xe; lVar28 = lVar28 + 2) {
        *(int16_t *)((long)ptr_02 + lVar28) = iVar38;
        *(undefined2 *)((long)ptr_03 + lVar28) = 0;
        *(undefined2 *)((long)ptr_04 + lVar28) = 0;
        *(undefined2 *)((long)local_128 + lVar28) = 0;
        *(int16_t *)((long)ptr_05 + lVar28) = iVar38;
        *(undefined2 *)((long)ptr_06 + lVar28) = 0;
        *(undefined2 *)((long)ptr_07 + lVar28) = 0;
        *(undefined2 *)((long)ptr_08 + lVar28) = 0;
      }
      for (lVar28 = 0; s2Len + (int)lVar28 < (int)uVar33; lVar28 = lVar28 + 1) {
        ptr_02[uVar36 + lVar28 + 7] = iVar38;
        ptr_03[uVar36 + lVar28 + 7] = 0;
        ptr_04[uVar36 + lVar28 + 7] = 0;
        local_128[uVar36 + lVar28 + 7] = 0;
        ptr_05[uVar36 + lVar28 + 7] = iVar38;
        ptr_06[uVar36 + lVar28 + 7] = 0;
        ptr_07[uVar36 + lVar28 + 7] = 0;
        ptr_08[uVar36 + lVar28 + 7] = 0;
      }
      ptr_02[6] = 0;
      uVar25 = uVar25 - 1;
      uVar35 = 0;
      uVar36 = (ulong)uVar33;
      if ((int)uVar33 < 1) {
        uVar36 = uVar35;
      }
      local_188._8_8_ = uStack_140;
      local_188._0_8_ = local_148;
      local_268._8_8_ = uStack_220;
      local_268._0_8_ = local_228;
      local_248._8_8_ = 0x100020003;
      local_248._0_8_ = 0x4000500060007;
      local_278._0_8_ = CONCAT26(sStack_286,CONCAT24(local_288,uVar46));
      local_278._8_8_ = CONCAT26(sStack_286,CONCAT24(local_288,uVar46));
      local_158._8_8_ = local_278._8_8_;
      local_158._0_8_ = local_278._0_8_;
      local_168._8_8_ = local_278._8_8_;
      local_168._0_8_ = local_278._0_8_;
      local_178._8_8_ = local_278._8_8_;
      local_178._0_8_ = local_278._0_8_;
      local_1d8 = CONCAT26(sStack_116,CONCAT24(local_118,auVar47._0_4_));
      uStack_1d0 = CONCAT26(sStack_116,CONCAT24(local_118,auVar47._0_4_));
      local_1c8 = local_278._0_8_;
      uStack_1c0 = local_278._8_8_;
      auVar47 = local_f8;
      for (; (long)uVar35 < lVar27; uVar35 = uVar35 + 8) {
        auVar79 = *(undefined1 (*) [16])(ptr_00 + uVar35);
        local_120 = uVar35;
        if (matrix->type == 0) {
          uVar33 = (uint)auVar79._0_2_;
          uVar42 = (uint)auVar79._2_2_;
          uVar44 = (uint)auVar79._4_2_;
          uVar41 = (uint)auVar79._6_2_;
          uVar34 = (uint)auVar79._8_2_;
          uVar40 = (uint)auVar79._10_2_;
          uVar39 = (uint)auVar79._12_2_;
          uVar18 = (int)auVar79._14_2_;
        }
        else {
          uVar33 = (uint)uVar35;
          uVar42 = uVar33 | 1;
          if (lVar27 <= (long)(uVar35 | 1)) {
            uVar42 = uVar25;
          }
          uVar44 = uVar33 | 2;
          if (lVar27 <= (long)(uVar35 | 2)) {
            uVar44 = uVar25;
          }
          uVar41 = uVar33 | 3;
          if (lVar27 <= (long)(uVar35 | 3)) {
            uVar41 = uVar25;
          }
          uVar34 = uVar33 | 4;
          if (lVar27 <= (long)(uVar35 | 4)) {
            uVar34 = uVar25;
          }
          uVar40 = uVar33 | 5;
          if (lVar27 <= (long)(uVar35 | 5)) {
            uVar40 = uVar25;
          }
          uVar39 = uVar33 | 6;
          if (lVar27 <= (long)(uVar35 | 6)) {
            uVar39 = uVar25;
          }
          uVar18 = uVar33 | 7;
          if (lVar27 <= (long)(uVar35 | 7)) {
            uVar18 = uVar25;
          }
        }
        local_a8 = pshufb(auVar79,_DAT_008a40d0);
        piVar1 = matrix->matrix;
        iVar43 = matrix->size;
        local_108._0_2_ = auVar48._0_2_;
        local_108._2_2_ = auVar48._2_2_;
        local_b8 = -(ushort)((short)local_248._0_2_ < (short)local_108);
        sStack_b6 = -(ushort)((short)local_248._2_2_ < local_108._2_2_);
        sStack_b4 = -(ushort)((short)local_248._4_2_ < (short)local_108);
        sStack_b2 = -(ushort)((short)local_248._6_2_ < local_108._2_2_);
        sStack_b0 = -(ushort)((short)local_248._8_2_ < (short)local_108);
        sStack_ae = -(ushort)((short)local_248._10_2_ < local_108._2_2_);
        sStack_ac = -(ushort)((short)local_248._12_2_ < (short)local_108);
        sStack_aa = -(ushort)((short)local_248._14_2_ < local_108._2_2_);
        uVar37 = 0;
        local_298 = (undefined1  [16])0x0;
        local_2c8 = (undefined1  [16])0x0;
        auVar103 = (undefined1  [16])0x0;
        auVar124 = (undefined1  [16])0x0;
        auVar114._4_2_ = local_288;
        auVar114._0_4_ = uVar46;
        auVar114._6_2_ = sStack_286;
        auVar114._8_2_ = local_288;
        auVar114._10_2_ = sStack_286;
        auVar114._12_2_ = local_288;
        auVar114._14_2_ = sStack_286;
        auVar121 = (undefined1  [16])0x0;
        local_2a8 = (undefined1  [16])0x0;
        auVar81 = (undefined1  [16])0x0;
        local_2d8 = pmovsxbw((undefined1  [16])0x0,0xfffefdfcfbfaf9);
        auVar79 = local_a8;
        auVar49 = (undefined1  [16])0x0;
        auVar127 = (undefined1  [16])0x0;
        auVar118 = auVar47;
        auVar86 = auVar114;
        auVar51 = (undefined1  [16])0x0;
        uVar113 = 0;
        uVar26 = 0;
        uVar70 = 0;
        uVar75 = 0;
        _local_238 = auVar114;
        for (; uVar36 != uVar37; uVar37 = uVar37 + 1) {
          local_58._0_8_ = auVar47._2_8_;
          local_58._8_8_ = auVar47._8_8_ >> 0x10 | (ulong)(ushort)ptr_02[uVar37 + 7] << 0x30;
          local_98 = uVar70;
          uStack_90 = uVar75;
          local_68._0_8_ = local_2c8._2_8_;
          uVar2 = local_2c8._8_8_ >> 0x10 | (ulong)(ushort)ptr_03[uVar37 + 7] << 0x30;
          local_68._8_8_ = uVar2;
          local_78._0_8_ = auVar103._2_8_;
          uVar3 = auVar103._8_8_ >> 0x10 | (ulong)(ushort)ptr_04[uVar37 + 7] << 0x30;
          local_78._8_8_ = uVar3;
          auVar120._0_8_ = auVar86._2_8_;
          auVar120._8_8_ = auVar86._8_8_ >> 0x10 | (ulong)(ushort)ptr_05[uVar37 + 7] << 0x30;
          auVar117._0_8_ = auVar127._2_8_;
          auVar117._8_8_ = auVar127._8_8_ >> 0x10 | (ulong)(ushort)ptr_06[uVar37 + 7] << 0x30;
          auVar122._0_8_ = auVar49._2_8_;
          auVar122._8_8_ = auVar49._8_8_ >> 0x10 | (ulong)(ushort)ptr_07[uVar37 + 7] << 0x30;
          auVar16._4_4_ = local_c8;
          auVar16._0_4_ = local_c8;
          auVar16._8_4_ = local_c8;
          auVar16._12_4_ = local_c8;
          auVar49 = psubsw(local_58,auVar16);
          local_1a8._8_8_ = uVar26;
          local_1a8._0_8_ = uVar113;
          auVar115._4_4_ = local_d8;
          auVar115._0_4_ = local_d8;
          auVar115._8_4_ = local_d8;
          auVar115._12_4_ = local_d8;
          auVar86 = psubsw(auVar120,auVar115);
          sVar45 = auVar49._0_2_;
          sVar83 = auVar86._0_2_;
          auVar50._0_2_ = -(ushort)(sVar83 < sVar45);
          sVar53 = auVar49._2_2_;
          sVar89 = auVar86._2_2_;
          auVar50._2_2_ = -(ushort)(sVar89 < sVar53);
          sVar55 = auVar49._4_2_;
          sVar91 = auVar86._4_2_;
          auVar50._4_2_ = -(ushort)(sVar91 < sVar55);
          sVar56 = auVar49._6_2_;
          sVar93 = auVar86._6_2_;
          auVar50._6_2_ = -(ushort)(sVar93 < sVar56);
          sVar57 = auVar49._8_2_;
          sVar95 = auVar86._8_2_;
          auVar50._8_2_ = -(ushort)(sVar95 < sVar57);
          sVar54 = auVar49._10_2_;
          sVar97 = auVar86._10_2_;
          auVar50._10_2_ = -(ushort)(sVar97 < sVar54);
          sVar58 = auVar49._12_2_;
          sVar99 = auVar86._12_2_;
          sVar59 = auVar49._14_2_;
          auVar50._12_2_ = -(ushort)(sVar99 < sVar58);
          sVar101 = auVar86._14_2_;
          auVar50._14_2_ = -(ushort)(sVar101 < sVar59);
          local_198 = pblendvb(auVar117,local_68,auVar50);
          auVar122 = pblendvb(auVar122,local_78,auVar50);
          local_88._0_8_ = auVar124._2_8_;
          uVar4 = auVar124._8_8_ >> 0x10 | (ulong)(ushort)local_128[uVar37 + 7] << 0x30;
          local_88._8_8_ = uVar4;
          auVar126._0_8_ = auVar51._2_8_;
          auVar126._8_8_ = auVar51._8_8_ >> 0x10 | (ulong)(ushort)ptr_08[uVar37 + 7] << 0x30;
          auVar127 = pblendvb(auVar126,local_88,auVar50);
          auVar49 = psubsw(auVar47,auVar16);
          auVar47 = psubsw(auVar114,auVar115);
          sVar69 = auVar47._0_2_;
          sVar104 = auVar49._0_2_;
          auVar105._0_2_ = -(ushort)(sVar69 < sVar104);
          sVar71 = auVar47._2_2_;
          sVar106 = auVar49._2_2_;
          auVar105._2_2_ = -(ushort)(sVar71 < sVar106);
          sVar72 = auVar47._4_2_;
          sVar107 = auVar49._4_2_;
          auVar105._4_2_ = -(ushort)(sVar72 < sVar107);
          sVar73 = auVar47._6_2_;
          sVar108 = auVar49._6_2_;
          auVar105._6_2_ = -(ushort)(sVar73 < sVar108);
          sVar74 = auVar47._8_2_;
          sVar109 = auVar49._8_2_;
          auVar105._8_2_ = -(ushort)(sVar74 < sVar109);
          sVar76 = auVar47._10_2_;
          sVar110 = auVar49._10_2_;
          auVar105._10_2_ = -(ushort)(sVar76 < sVar110);
          sVar77 = auVar47._12_2_;
          sVar111 = auVar49._12_2_;
          sVar112 = auVar49._14_2_;
          auVar105._12_2_ = -(ushort)(sVar77 < sVar111);
          sVar78 = auVar47._14_2_;
          auVar105._14_2_ = -(ushort)(sVar78 < sVar112);
          auVar121 = pblendvb(auVar121,local_2c8,auVar105);
          auVar116._10_2_ = (short)piVar1[(long)(int)(uVar44 * iVar43) + (long)ptr_01[uVar37 + 5]];
          auVar116._8_2_ = (short)piVar1[(long)(int)(uVar41 * iVar43) + (long)ptr_01[uVar37 + 4]];
          auVar116._12_2_ = (short)piVar1[(long)(int)(uVar42 * iVar43) + (long)ptr_01[uVar37 + 6]];
          uVar19 = local_238._2_2_;
          sVar30 = sStack_234;
          sVar5 = sStack_232;
          sVar7 = sStack_230;
          sVar9 = sStack_22e;
          sVar11 = sStack_22c;
          sVar12 = sStack_22a;
          sVar24 = ptr_01[uVar37 + 7];
          auVar116._14_2_ = (short)piVar1[(long)(int)(uVar33 * iVar43) + (long)sVar24];
          auVar116._0_8_ =
               (ulong)(uint)piVar1[(long)(int)(uVar18 * iVar43) + (long)ptr_01[uVar37]] &
               0xffffffff0000ffff |
               (ulong)*(ushort *)(piVar1 + (long)(int)(uVar39 * iVar43) + (long)ptr_01[uVar37 + 1])
               << 0x10 | (ulong)*(ushort *)
                                 (piVar1 + (long)(int)(uVar40 * iVar43) + (long)ptr_01[uVar37 + 2])
                         << 0x20 |
               (ulong)*(ushort *)(piVar1 + (long)(int)(uVar34 * iVar43) + (long)ptr_01[uVar37 + 3])
               << 0x30;
          local_48 = (ushort)(sVar45 < sVar83) * sVar83 | (ushort)(sVar45 >= sVar83) * sVar45;
          uStack_46 = (ushort)(sVar53 < sVar89) * sVar89 | (ushort)(sVar53 >= sVar89) * sVar53;
          uStack_44 = (ushort)(sVar55 < sVar91) * sVar91 | (ushort)(sVar55 >= sVar91) * sVar55;
          uStack_42 = (ushort)(sVar56 < sVar93) * sVar93 | (ushort)(sVar56 >= sVar93) * sVar56;
          uStack_40 = (ushort)(sVar57 < sVar95) * sVar95 | (ushort)(sVar57 >= sVar95) * sVar57;
          uStack_3e = (ushort)(sVar54 < sVar97) * sVar97 | (ushort)(sVar54 >= sVar97) * sVar54;
          uStack_3c = (ushort)(sVar58 < sVar99) * sVar99 | (ushort)(sVar58 >= sVar99) * sVar58;
          uStack_3a = (ushort)(sVar59 < sVar101) * sVar101 | (ushort)(sVar59 >= sVar101) * sVar59;
          local_2c8._0_2_ =
               (ushort)(sVar104 < sVar69) * sVar69 | (ushort)(sVar104 >= sVar69) * sVar104;
          local_2c8._2_2_ =
               (ushort)(sVar106 < sVar71) * sVar71 | (ushort)(sVar106 >= sVar71) * sVar106;
          local_2c8._4_2_ =
               (ushort)(sVar107 < sVar72) * sVar72 | (ushort)(sVar107 >= sVar72) * sVar107;
          local_2c8._6_2_ =
               (ushort)(sVar108 < sVar73) * sVar73 | (ushort)(sVar108 >= sVar73) * sVar108;
          local_2c8._8_2_ =
               (ushort)(sVar109 < sVar74) * sVar74 | (ushort)(sVar109 >= sVar74) * sVar109;
          local_2c8._10_2_ =
               (ushort)(sVar110 < sVar76) * sVar76 | (ushort)(sVar110 >= sVar76) * sVar110;
          local_2c8._12_2_ =
               (ushort)(sVar111 < sVar77) * sVar77 | (ushort)(sVar111 >= sVar77) * sVar111;
          local_2c8._14_2_ =
               (ushort)(sVar112 < sVar78) * sVar78 | (ushort)(sVar112 >= sVar78) * sVar112;
          local_2a8 = pblendvb(local_2a8,auVar103,auVar105);
          auVar86 = pblendvb(auVar81,auVar124,auVar105);
          auVar47 = paddsw(auVar118,auVar116);
          uVar84 = ((short)local_2c8._0_2_ < (short)local_48) * local_48 |
                   (ushort)((short)local_2c8._0_2_ >= (short)local_48) * local_2c8._0_2_;
          uVar90 = ((short)local_2c8._2_2_ < (short)uStack_46) * uStack_46 |
                   (ushort)((short)local_2c8._2_2_ >= (short)uStack_46) * local_2c8._2_2_;
          uVar92 = ((short)local_2c8._4_2_ < (short)uStack_44) * uStack_44 |
                   (ushort)((short)local_2c8._4_2_ >= (short)uStack_44) * local_2c8._4_2_;
          uVar94 = ((short)local_2c8._6_2_ < (short)uStack_42) * uStack_42 |
                   (ushort)((short)local_2c8._6_2_ >= (short)uStack_42) * local_2c8._6_2_;
          uVar96 = ((short)local_2c8._8_2_ < (short)uStack_40) * uStack_40 |
                   (ushort)((short)local_2c8._8_2_ >= (short)uStack_40) * local_2c8._8_2_;
          uVar98 = ((short)local_2c8._10_2_ < (short)uStack_3e) * uStack_3e |
                   (ushort)((short)local_2c8._10_2_ >= (short)uStack_3e) * local_2c8._10_2_;
          uVar100 = ((short)local_2c8._12_2_ < (short)uStack_3c) * uStack_3c |
                    (ushort)((short)local_2c8._12_2_ >= (short)uStack_3c) * local_2c8._12_2_;
          uVar102 = ((short)local_2c8._14_2_ < (short)uStack_3a) * uStack_3a |
                    (ushort)((short)local_2c8._14_2_ >= (short)uStack_3a) * local_2c8._14_2_;
          uVar60 = auVar47._0_2_;
          uVar85 = ((short)uVar84 < (short)uVar60) * uVar60 |
                   ((short)uVar84 >= (short)uVar60) * uVar84;
          uVar62 = auVar47._2_2_;
          uVar84 = ((short)uVar90 < (short)uVar62) * uVar62 |
                   ((short)uVar90 >= (short)uVar62) * uVar90;
          uVar63 = auVar47._4_2_;
          uVar90 = ((short)uVar92 < (short)uVar63) * uVar63 |
                   ((short)uVar92 >= (short)uVar63) * uVar92;
          uVar64 = auVar47._6_2_;
          uVar92 = ((short)uVar94 < (short)uVar64) * uVar64 |
                   ((short)uVar94 >= (short)uVar64) * uVar94;
          uVar65 = auVar47._8_2_;
          uVar94 = ((short)uVar96 < (short)uVar65) * uVar65 |
                   ((short)uVar96 >= (short)uVar65) * uVar96;
          uVar66 = auVar47._10_2_;
          uVar96 = ((short)uVar98 < (short)uVar66) * uVar66 |
                   ((short)uVar98 >= (short)uVar66) * uVar98;
          uVar67 = auVar47._12_2_;
          uVar98 = ((short)uVar100 < (short)uVar67) * uVar67 |
                   ((short)uVar100 >= (short)uVar67) * uVar100;
          uVar68 = auVar47._14_2_;
          uVar100 = ((short)uVar102 < (short)uVar68) * uVar68 |
                    ((short)uVar102 >= (short)uVar68) * uVar102;
          auVar49 = pmovsxbw(local_88,0x101010101010101);
          auVar125._0_2_ = -(ushort)((short)uVar85 < auVar49._0_2_);
          auVar125._2_2_ = -(ushort)((short)uVar84 < auVar49._2_2_);
          auVar125._4_2_ = -(ushort)((short)uVar90 < auVar49._4_2_);
          auVar125._6_2_ = -(ushort)((short)uVar92 < auVar49._6_2_);
          auVar125._8_2_ = -(ushort)((short)uVar94 < auVar49._8_2_);
          auVar125._10_2_ = -(ushort)((short)uVar96 < auVar49._10_2_);
          auVar125._12_2_ = -(ushort)((short)uVar98 < auVar49._12_2_);
          auVar125._14_2_ = -(ushort)((short)uVar100 < auVar49._14_2_);
          uVar85 = (-1 < (short)uVar85) * uVar85;
          uVar84 = (-1 < (short)uVar84) * uVar84;
          auVar87._2_2_ = uVar84;
          auVar87._0_2_ = uVar85;
          uVar90 = (-1 < (short)uVar90) * uVar90;
          auVar87._4_2_ = uVar90;
          uVar92 = (-1 < (short)uVar92) * uVar92;
          auVar87._6_2_ = uVar92;
          uVar94 = (-1 < (short)uVar94) * uVar94;
          auVar87._8_2_ = uVar94;
          uVar96 = (-1 < (short)uVar96) * uVar96;
          auVar87._10_2_ = uVar96;
          uVar98 = (-1 < (short)uVar98) * uVar98;
          auVar87._12_2_ = uVar98;
          uVar100 = (-1 < (short)uVar100) * uVar100;
          auVar87._14_2_ = uVar100;
          auVar124._0_2_ = -(ushort)(uVar85 == local_48);
          auVar124._2_2_ = -(ushort)(uVar84 == uStack_46);
          auVar124._4_2_ = -(ushort)(uVar90 == uStack_44);
          auVar124._6_2_ = -(ushort)(uVar92 == uStack_42);
          auVar124._8_2_ = -(ushort)(uVar94 == uStack_40);
          auVar124._10_2_ = -(ushort)(uVar96 == uStack_3e);
          auVar124._12_2_ = -(ushort)(uVar98 == uStack_3c);
          auVar124._14_2_ = -(ushort)(uVar100 == uStack_3a);
          auVar114 = pblendvb(auVar121,local_198,auVar124);
          auVar119._0_2_ = -(ushort)(uVar60 == uVar85);
          auVar119._2_2_ = -(ushort)(uVar62 == uVar84);
          auVar119._4_2_ = -(ushort)(uVar63 == uVar90);
          auVar119._6_2_ = -(ushort)(uVar64 == uVar92);
          auVar119._8_2_ = -(ushort)(uVar65 == uVar94);
          auVar119._10_2_ = -(ushort)(uVar66 == uVar96);
          auVar119._12_2_ = -(ushort)(uVar67 == uVar98);
          auVar119._14_2_ = -(ushort)(uVar68 == uVar100);
          _local_238 = stack0xfffffffffffffdca;
          sStack_22a = sVar24;
          auVar51._0_2_ = (ushort)-(ushort)(local_a8._0_2_ == uVar19) >> 0xf;
          auVar51._2_2_ = (ushort)-(ushort)(local_a8._2_2_ == sVar30) >> 0xf;
          auVar51._4_2_ = (ushort)-(ushort)(local_a8._4_2_ == sVar5) >> 0xf;
          auVar51._6_2_ = (ushort)-(ushort)(local_a8._6_2_ == sVar7) >> 0xf;
          auVar51._8_2_ = (ushort)-(ushort)(local_a8._8_2_ == sVar9) >> 0xf;
          auVar51._10_2_ = (ushort)-(ushort)(local_a8._10_2_ == sVar11) >> 0xf;
          auVar51._12_2_ = (ushort)-(ushort)(local_a8._12_2_ == sVar12) >> 0xf;
          auVar51._14_2_ = (ushort)-(ushort)(local_a8._14_2_ == sVar24) >> 0xf;
          auVar47 = paddsw(local_1a8,auVar51);
          auVar115 = pblendvb(auVar114,auVar47,auVar119);
          local_1a8 = auVar122;
          auVar114 = pblendvb(local_2a8,auVar122,auVar124);
          auVar81._0_2_ =
               (ushort)-(ushort)(0 < (short)((ulong)(uint)piVar1[(long)(int)(uVar18 * iVar43) +
                                                                 (long)ptr_01[uVar37]] &
                                            0xffffffff0000ffff)) >> 0xf;
          auVar81._2_2_ =
               (ushort)-(ushort)(0 < (short)*(ushort *)
                                             (piVar1 + (long)(int)(uVar39 * iVar43) +
                                                       (long)ptr_01[uVar37 + 1])) >> 0xf;
          auVar81._4_2_ =
               (ushort)-(ushort)(0 < (short)*(ushort *)
                                             (piVar1 + (long)(int)(uVar40 * iVar43) +
                                                       (long)ptr_01[uVar37 + 2])) >> 0xf;
          auVar81._6_2_ =
               (ushort)-(ushort)(0 < (short)*(ushort *)
                                             (piVar1 + (long)(int)(uVar34 * iVar43) +
                                                       (long)ptr_01[uVar37 + 3])) >> 0xf;
          auVar81._8_2_ =
               (ushort)-(ushort)(0 < (short)piVar1[(long)(int)(uVar41 * iVar43) +
                                                   (long)ptr_01[uVar37 + 4]]) >> 0xf;
          auVar81._10_2_ =
               (ushort)-(ushort)(0 < (short)piVar1[(long)(int)(uVar44 * iVar43) +
                                                   (long)ptr_01[uVar37 + 5]]) >> 0xf;
          auVar81._12_2_ =
               (ushort)-(ushort)(0 < (short)piVar1[(long)(int)(uVar42 * iVar43) +
                                                   (long)ptr_01[uVar37 + 6]]) >> 0xf;
          auVar81._14_2_ =
               (ushort)-(ushort)(0 < (short)piVar1[(long)(int)(uVar33 * iVar43) + (long)sVar24]) >>
               0xf;
          auVar47 = paddsw(local_298,auVar81);
          auVar103 = pblendvb(auVar114,auVar47,auVar119);
          local_1b8 = paddsw(auVar127,auVar49);
          auVar81 = paddsw(auVar86,auVar49);
          auVar114 = pblendvb(auVar81,local_1b8,auVar124);
          auVar118._8_8_ = uVar75;
          auVar118._0_8_ = uVar70;
          auVar47 = paddsw(auVar118,auVar49);
          auVar124 = pblendvb(auVar114,auVar47,auVar119);
          auVar82._0_2_ = -(ushort)(local_2d8._0_2_ == -1);
          auVar82._2_2_ = -(ushort)(local_2d8._2_2_ == -1);
          auVar82._4_2_ = -(ushort)(local_2d8._4_2_ == -1);
          auVar82._6_2_ = -(ushort)(local_2d8._6_2_ == -1);
          auVar82._8_2_ = -(ushort)(local_2d8._8_2_ == -1);
          auVar82._10_2_ = -(ushort)(local_2d8._10_2_ == -1);
          auVar82._12_2_ = -(ushort)(local_2d8._12_2_ == -1);
          auVar82._14_2_ = -(ushort)(local_2d8._14_2_ == -1);
          auVar125 = auVar125 | auVar82;
          auVar115 = ~auVar125 & auVar115;
          auVar103 = ~auVar125 & auVar103;
          auVar127._4_2_ = local_288;
          auVar127._0_4_ = uVar46;
          auVar127._6_2_ = sStack_286;
          auVar127._8_2_ = local_288;
          auVar127._10_2_ = sStack_286;
          auVar127._12_2_ = local_288;
          auVar127._14_2_ = sStack_286;
          auVar114 = pblendvb(local_2c8,auVar127,auVar82);
          auVar124 = ~auVar125 & auVar124;
          auVar47 = ~auVar82 & auVar87;
          sVar5 = auVar47._0_2_;
          sVar7 = auVar47._2_2_;
          sVar55 = auVar47._14_2_;
          sVar9 = auVar47._4_2_;
          sVar11 = auVar47._6_2_;
          sVar12 = auVar47._8_2_;
          sVar45 = auVar47._10_2_;
          sVar53 = auVar47._12_2_;
          sVar24 = auVar115._0_2_;
          sVar30 = auVar124._0_2_;
          sVar56 = auVar103._0_2_;
          if (7 < uVar37) {
            bVar6 = sVar5 < (short)local_1d8;
            uVar84 = (ushort)!bVar6 * (short)local_1d8;
            bVar8 = sVar7 < local_1d8._2_2_;
            uVar85 = (ushort)!bVar8 * local_1d8._2_2_;
            bVar10 = sVar9 < local_1d8._4_2_;
            uVar90 = (ushort)!bVar10 * local_1d8._4_2_;
            bVar13 = sVar12 < (short)uStack_1d0;
            uVar92 = (ushort)!bVar13 * (short)uStack_1d0;
            bVar14 = sVar45 < uStack_1d0._2_2_;
            uVar94 = (ushort)!bVar14 * uStack_1d0._2_2_;
            bVar15 = sVar53 < uStack_1d0._4_2_;
            uVar96 = (ushort)!bVar15 * uStack_1d0._4_2_;
            local_1d8 = CONCAT26((ushort)(sVar11 < local_1d8._6_2_) * sVar11 |
                                 (ushort)(sVar11 >= local_1d8._6_2_) * local_1d8._6_2_,
                                 CONCAT24((ushort)bVar10 * sVar9 | uVar90,
                                          CONCAT22((ushort)bVar8 * sVar7 | uVar85,
                                                   (ushort)bVar6 * sVar5 | uVar84)));
            uStack_1d0 = CONCAT26((ushort)(sVar55 < uStack_1d0._6_2_) * sVar55 |
                                  (ushort)(sVar55 >= uStack_1d0._6_2_) * uStack_1d0._6_2_,
                                  CONCAT24((ushort)bVar15 * sVar53 | uVar96,
                                           CONCAT22((ushort)bVar14 * sVar45 | uVar94,
                                                    (ushort)bVar13 * sVar12 | uVar92)));
            uVar84 = (ushort)((short)local_1c8 < sVar5) * sVar5 |
                     (ushort)((short)local_1c8 >= sVar5) * (short)local_1c8;
            uVar85 = (ushort)(local_1c8._2_2_ < sVar7) * sVar7 |
                     (ushort)(local_1c8._2_2_ >= sVar7) * local_1c8._2_2_;
            uVar90 = (ushort)(local_1c8._4_2_ < sVar9) * sVar9 |
                     (ushort)(local_1c8._4_2_ >= sVar9) * local_1c8._4_2_;
            uVar92 = (ushort)(local_1c8._6_2_ < sVar11) * sVar11 |
                     (ushort)(local_1c8._6_2_ >= sVar11) * local_1c8._6_2_;
            uVar94 = (ushort)((short)uStack_1c0 < sVar12) * sVar12 |
                     (ushort)((short)uStack_1c0 >= sVar12) * (short)uStack_1c0;
            uVar96 = (ushort)(uStack_1c0._2_2_ < sVar45) * sVar45 |
                     (ushort)(uStack_1c0._2_2_ >= sVar45) * uStack_1c0._2_2_;
            uVar98 = (ushort)(uStack_1c0._4_2_ < sVar53) * sVar53 |
                     (ushort)(uStack_1c0._4_2_ >= sVar53) * uStack_1c0._4_2_;
            uVar100 = (ushort)(uStack_1c0._6_2_ < sVar55) * sVar55 |
                      (ushort)(uStack_1c0._6_2_ >= sVar55) * uStack_1c0._6_2_;
            uVar60 = (ushort)((short)uVar84 < sVar24) * sVar24 | ((short)uVar84 >= sVar24) * uVar84;
            sVar57 = auVar115._2_2_;
            uVar62 = (ushort)((short)uVar85 < sVar57) * sVar57 | ((short)uVar85 >= sVar57) * uVar85;
            sVar57 = auVar115._4_2_;
            uVar63 = (ushort)((short)uVar90 < sVar57) * sVar57 | ((short)uVar90 >= sVar57) * uVar90;
            sVar57 = auVar115._6_2_;
            uVar64 = (ushort)((short)uVar92 < sVar57) * sVar57 | ((short)uVar92 >= sVar57) * uVar92;
            sVar57 = auVar115._8_2_;
            uVar65 = (ushort)((short)uVar94 < sVar57) * sVar57 | ((short)uVar94 >= sVar57) * uVar94;
            sVar57 = auVar115._10_2_;
            uVar66 = (ushort)((short)uVar96 < sVar57) * sVar57 | ((short)uVar96 >= sVar57) * uVar96;
            sVar57 = auVar115._12_2_;
            uVar67 = (ushort)((short)uVar98 < sVar57) * sVar57 | ((short)uVar98 >= sVar57) * uVar98;
            sVar57 = auVar115._14_2_;
            uVar68 = (ushort)((short)uVar100 < sVar57) * sVar57 |
                     ((short)uVar100 >= sVar57) * uVar100;
            uVar84 = (ushort)(sVar56 < sVar30) * sVar30 | (ushort)(sVar56 >= sVar30) * sVar56;
            sVar57 = auVar124._2_2_;
            sVar54 = auVar103._2_2_;
            uVar85 = (ushort)(sVar54 < sVar57) * sVar57 | (ushort)(sVar54 >= sVar57) * sVar54;
            sVar57 = auVar124._4_2_;
            sVar54 = auVar103._4_2_;
            uVar90 = (ushort)(sVar54 < sVar57) * sVar57 | (ushort)(sVar54 >= sVar57) * sVar54;
            sVar57 = auVar124._6_2_;
            sVar54 = auVar103._6_2_;
            uVar92 = (ushort)(sVar54 < sVar57) * sVar57 | (ushort)(sVar54 >= sVar57) * sVar54;
            sVar57 = auVar124._8_2_;
            sVar54 = auVar103._8_2_;
            uVar94 = (ushort)(sVar54 < sVar57) * sVar57 | (ushort)(sVar54 >= sVar57) * sVar54;
            sVar57 = auVar124._10_2_;
            sVar54 = auVar103._10_2_;
            uVar96 = (ushort)(sVar54 < sVar57) * sVar57 | (ushort)(sVar54 >= sVar57) * sVar54;
            sVar57 = auVar124._12_2_;
            sVar54 = auVar103._12_2_;
            sVar58 = auVar103._14_2_;
            uVar98 = (ushort)(sVar54 < sVar57) * sVar57 | (ushort)(sVar54 >= sVar57) * sVar54;
            sVar57 = auVar124._14_2_;
            uVar100 = (ushort)(sVar58 < sVar57) * sVar57 | (ushort)(sVar58 >= sVar57) * sVar58;
            local_1c8 = CONCAT26(((short)uVar64 < (short)uVar92) * uVar92 |
                                 ((short)uVar64 >= (short)uVar92) * uVar64,
                                 CONCAT24(((short)uVar63 < (short)uVar90) * uVar90 |
                                          ((short)uVar63 >= (short)uVar90) * uVar63,
                                          CONCAT22(((short)uVar62 < (short)uVar85) * uVar85 |
                                                   ((short)uVar62 >= (short)uVar85) * uVar62,
                                                   ((short)uVar60 < (short)uVar84) * uVar84 |
                                                   ((short)uVar60 >= (short)uVar84) * uVar60)));
            uStack_1c0 = CONCAT26(((short)uVar68 < (short)uVar100) * uVar100 |
                                  ((short)uVar68 >= (short)uVar100) * uVar68,
                                  CONCAT24(((short)uVar67 < (short)uVar98) * uVar98 |
                                           ((short)uVar67 >= (short)uVar98) * uVar67,
                                           CONCAT22(((short)uVar66 < (short)uVar96) * uVar96 |
                                                    ((short)uVar66 >= (short)uVar96) * uVar66,
                                                    ((short)uVar65 < (short)uVar94) * uVar94 |
                                                    ((short)uVar65 >= (short)uVar94) * uVar65)));
          }
          local_e8._0_2_ = auVar80._0_2_;
          local_e8._2_2_ = auVar80._2_2_;
          auVar52._0_2_ = -(ushort)((short)local_2d8._0_2_ < (short)local_e8);
          auVar52._2_2_ = -(ushort)((short)local_2d8._2_2_ < local_e8._2_2_);
          auVar52._4_2_ = -(ushort)((short)local_2d8._4_2_ < (short)local_e8);
          auVar52._6_2_ = -(ushort)((short)local_2d8._6_2_ < local_e8._2_2_);
          auVar52._8_2_ = -(ushort)((short)local_2d8._8_2_ < (short)local_e8);
          auVar52._10_2_ = -(ushort)((short)local_2d8._10_2_ < local_e8._2_2_);
          auVar52._12_2_ = -(ushort)((short)local_2d8._12_2_ < (short)local_e8);
          auVar52._14_2_ = -(ushort)((short)local_2d8._14_2_ < local_e8._2_2_);
          auVar17._2_2_ = -(ushort)((short)local_248._2_2_ < local_108._2_2_);
          auVar17._0_2_ = -(ushort)((short)local_248._0_2_ < (short)local_108);
          auVar17._4_2_ = -(ushort)((short)local_248._4_2_ < (short)local_108);
          auVar17._6_2_ = -(ushort)((short)local_248._6_2_ < local_108._2_2_);
          auVar17._8_2_ = -(ushort)((short)local_248._8_2_ < (short)local_108);
          auVar17._10_2_ = -(ushort)((short)local_248._10_2_ < local_108._2_2_);
          auVar17._12_2_ = -(ushort)((short)local_248._12_2_ < (short)local_108);
          auVar17._14_2_ = -(ushort)((short)local_248._14_2_ < local_108._2_2_);
          auVar49 = psraw(local_2d8,0xf);
          auVar86 = ~auVar49 & auVar52 & auVar17;
          auVar123._0_2_ = -(ushort)(sVar5 == local_188._0_2_);
          auVar123._2_2_ = -(ushort)(sVar7 == local_188._2_2_);
          auVar123._4_2_ = -(ushort)(sVar9 == local_188._4_2_);
          auVar123._6_2_ = -(ushort)(sVar11 == local_188._6_2_);
          auVar123._8_2_ = -(ushort)(sVar12 == local_188._8_2_);
          auVar123._10_2_ = -(ushort)(sVar45 == local_188._10_2_);
          auVar123._12_2_ = -(ushort)(sVar53 == local_188._12_2_);
          auVar123._14_2_ = -(ushort)(sVar55 == local_188._14_2_);
          auVar61._0_2_ = -(ushort)(local_188._0_2_ < sVar5);
          auVar61._2_2_ = -(ushort)(local_188._2_2_ < sVar7);
          auVar61._4_2_ = -(ushort)(local_188._4_2_ < sVar9);
          auVar61._6_2_ = -(ushort)(local_188._6_2_ < sVar11);
          auVar61._8_2_ = -(ushort)(local_188._8_2_ < sVar12);
          auVar61._10_2_ = -(ushort)(local_188._10_2_ < sVar45);
          auVar61._12_2_ = -(ushort)(local_188._12_2_ < sVar53);
          auVar61._14_2_ = -(ushort)(local_188._14_2_ < sVar55);
          local_188 = pblendvb(local_188,auVar87,auVar61 & auVar86);
          auVar88._0_2_ = -(ushort)((short)local_2d8._0_2_ < local_268._0_2_);
          auVar88._2_2_ = -(ushort)((short)local_2d8._2_2_ < local_268._2_2_);
          auVar88._4_2_ = -(ushort)((short)local_2d8._4_2_ < local_268._4_2_);
          auVar88._6_2_ = -(ushort)((short)local_2d8._6_2_ < local_268._6_2_);
          auVar88._8_2_ = -(ushort)((short)local_2d8._8_2_ < local_268._8_2_);
          auVar88._10_2_ = -(ushort)((short)local_2d8._10_2_ < local_268._10_2_);
          auVar88._12_2_ = -(ushort)((short)local_2d8._12_2_ < local_268._12_2_);
          auVar88._14_2_ = -(ushort)((short)local_2d8._14_2_ < local_268._14_2_);
          auVar49 = pblendvb(auVar61 & auVar86,auVar86,auVar88 & auVar123);
          local_178 = pblendvb(local_178,auVar115,auVar49);
          local_168 = pblendvb(local_168,auVar103,auVar49);
          local_158 = pblendvb(local_158,auVar124,auVar49);
          ptr_02[uVar37] = sVar5;
          local_278 = pblendvb(local_278,local_248,auVar49);
          ptr_03[uVar37] = sVar24;
          auVar121 = ~auVar82 & auVar121;
          ptr_04[uVar37] = sVar56;
          local_128[uVar37] = sVar30;
          local_268 = pblendvb(local_268,local_2d8,(auVar88 & auVar123 | auVar61) & auVar86);
          auVar86._2_2_ = uStack_46;
          auVar86._0_2_ = local_48;
          auVar86._4_2_ = uStack_44;
          auVar86._6_2_ = uStack_42;
          auVar86._8_2_ = uStack_40;
          auVar86._10_2_ = uStack_3e;
          auVar86._12_2_ = uStack_3c;
          auVar86._14_2_ = uStack_3a;
          ptr_05[uVar37] = local_48;
          local_2a8 = ~auVar82 & local_2a8;
          ptr_06[uVar37] = local_198._0_2_;
          auVar81 = ~auVar82 & auVar81;
          ptr_07[uVar37] = auVar122._0_2_;
          ptr_08[uVar37] = local_1b8._0_2_;
          auVar49 = pmovsxbw(local_1b8,0x101010101010101);
          local_2d8 = paddsw(local_2d8,auVar49);
          local_298._8_8_ = uVar3;
          local_298._0_8_ = local_78._0_8_;
          auVar49 = local_1a8;
          auVar127 = local_198;
          auVar118 = local_58;
          auVar51 = local_1b8;
          uVar113 = local_68._0_8_;
          uVar26 = uVar2;
          uVar70 = local_88._0_8_;
          uVar75 = uVar4;
          local_2c8 = auVar115;
        }
        local_248 = paddsw(local_248,_DAT_008a1bb0);
        auVar47 = local_f8;
        local_a8 = auVar79;
      }
      local_148 = local_188._0_8_;
      uStack_140 = local_188._8_8_;
      local_228 = local_268._0_8_;
      uStack_220 = local_268._8_8_;
      local_1e8 = local_178._0_8_;
      uStack_1e0 = local_178._8_8_;
      local_1f8 = local_168._0_8_;
      uStack_1f0 = local_168._8_8_;
      local_208 = local_158._0_8_;
      uStack_200 = local_158._8_8_;
      local_218 = local_278._0_8_;
      uStack_210 = local_278._8_8_;
      lVar28 = 0;
      iVar32 = 0;
      iVar43 = 0;
      uVar25 = uVar31;
      uVar33 = uVar31;
      local_30c = uVar31;
      while( true ) {
        sVar24 = (short)uVar25;
        sVar30 = (short)uVar33;
        uVar84 = (ushort)uVar31;
        if ((int)lVar28 == 8) break;
        uVar85 = *(ushort *)((long)&local_148 + lVar28 * 2);
        if ((short)uVar84 < (short)uVar85) {
          uVar33 = (uint)*(ushort *)((long)&local_1e8 + lVar28 * 2);
          local_30c = (uint)*(ushort *)((long)&local_1f8 + lVar28 * 2);
          uVar25 = (uint)*(ushort *)((long)&local_208 + lVar28 * 2);
          iVar43 = (int)*(short *)((long)&local_218 + lVar28 * 2);
          iVar32 = (int)*(short *)((long)&local_228 + lVar28 * 2);
          uVar31 = (uint)uVar85;
        }
        else if (uVar85 == uVar84) {
          iVar23 = (int)*(short *)((long)&local_228 + lVar28 * 2);
          if (iVar23 < iVar32) {
            uVar33 = (uint)*(ushort *)((long)&local_1e8 + lVar28 * 2);
            local_30c = (uint)*(ushort *)((long)&local_1f8 + lVar28 * 2);
            uVar25 = (uint)*(ushort *)((long)&local_208 + lVar28 * 2);
            iVar43 = (int)*(short *)((long)&local_218 + lVar28 * 2);
            iVar32 = iVar23;
          }
          else if ((iVar32 == iVar23) &&
                  (iVar23 = (int)*(short *)((long)&local_218 + lVar28 * 2), iVar23 < iVar43)) {
            uVar33 = (uint)*(ushort *)((long)&local_1e8 + lVar28 * 2);
            local_30c = (uint)*(ushort *)((long)&local_1f8 + lVar28 * 2);
            uVar25 = (uint)*(ushort *)((long)&local_208 + lVar28 * 2);
            iVar43 = iVar23;
          }
        }
        lVar28 = lVar28 + 1;
      }
      auVar103._0_2_ = -(ushort)((short)local_1d8 < local_288);
      auVar103._2_2_ = -(ushort)(local_1d8._2_2_ < sStack_286);
      auVar103._4_2_ = -(ushort)(local_1d8._4_2_ < local_288);
      auVar103._6_2_ = -(ushort)(local_1d8._6_2_ < sStack_286);
      auVar103._8_2_ = -(ushort)((short)uStack_1d0 < local_288);
      auVar103._10_2_ = -(ushort)(uStack_1d0._2_2_ < sStack_286);
      auVar103._12_2_ = -(ushort)(uStack_1d0._4_2_ < local_288);
      auVar103._14_2_ = -(ushort)(uStack_1d0._6_2_ < sStack_286);
      auVar121._0_2_ = -(ushort)(local_118 < (short)local_1c8);
      auVar121._2_2_ = -(ushort)(sStack_116 < local_1c8._2_2_);
      auVar121._4_2_ = -(ushort)(local_118 < local_1c8._4_2_);
      auVar121._6_2_ = -(ushort)(sStack_116 < local_1c8._6_2_);
      auVar121._8_2_ = -(ushort)(local_118 < (short)uStack_1c0);
      auVar121._10_2_ = -(ushort)(sStack_116 < uStack_1c0._2_2_);
      auVar121._12_2_ = -(ushort)(local_118 < uStack_1c0._4_2_);
      auVar121._14_2_ = -(ushort)(sStack_116 < uStack_1c0._6_2_);
      auVar121 = auVar121 | auVar103;
      if ((((((((((((((((auVar121 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar121 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar121 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar121 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar121 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar121 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar121 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar121 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar121 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar121 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar121 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar121 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar121 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar121 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar121 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          auVar121[0xf] < '\0') {
        *(byte *)&local_130->flag = (byte)local_130->flag | 0x40;
        local_30c._0_2_ = 0;
        sVar24 = 0;
        sVar30 = 0;
        uVar84 = 0;
        iVar32 = 0;
        iVar43 = 0;
      }
      local_130->score = (int)(short)uVar84;
      local_130->end_query = iVar43;
      local_130->end_ref = iVar32;
      *(int *)(local_130->field_4).extra = (int)sVar30;
      ((local_130->field_4).stats)->similar = (int)(short)local_30c;
      ((local_130->field_4).stats)->length = (int)sVar24;
      sStack_114 = local_118;
      sStack_112 = sStack_116;
      sStack_110 = local_118;
      sStack_10e = sStack_116;
      sStack_10c = local_118;
      sStack_10a = sStack_116;
      local_108 = uVar21;
      local_e8 = uVar22;
      parasail_free(ptr_08);
      parasail_free(ptr_07);
      parasail_free(ptr_06);
      parasail_free(ptr_05);
      parasail_free(ptr);
      parasail_free(ptr_04);
      parasail_free(ptr_03);
      parasail_free(ptr_02);
      parasail_free(ptr_01);
      parasail_free(ptr_00);
      return ppVar20;
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _HM_pr = NULL;
    int16_t * restrict _HS_pr = NULL;
    int16_t * restrict _HL_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict _FM_pr = NULL;
    int16_t * restrict _FS_pr = NULL;
    int16_t * restrict _FL_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict HM_pr = NULL;
    int16_t * restrict HS_pr = NULL;
    int16_t * restrict HL_pr = NULL;
    int16_t * restrict F_pr = NULL;
    int16_t * restrict FM_pr = NULL;
    int16_t * restrict FS_pr = NULL;
    int16_t * restrict FL_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    int16_t matches = 0;
    int16_t similar = 0;
    int16_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vNegInf0;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vOne;
    __m128i vN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxH;
    __m128i vMaxM;
    __m128i vMaxS;
    __m128i vMaxL;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vJLimit;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 8; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    matches = NEG_LIMIT;
    similar = NEG_LIMIT;
    length = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi16(NEG_LIMIT);
    vNegInf0 = _mm_srli_si128(vNegInf, 2); /* shift in a 0 */
    vOpen = _mm_set1_epi16(open);
    vGap  = _mm_set1_epi16(gap);
    vZero = _mm_set1_epi16(0);
    vOne = _mm_set1_epi16(1);
    vN = _mm_set1_epi16(N);
    vNegOne = _mm_set1_epi16(-1);
    vI = _mm_set_epi16(0,1,2,3,4,5,6,7);
    vJreset = _mm_set_epi16(0,-1,-2,-3,-4,-5,-6,-7);
    vMaxH = vNegInf;
    vMaxM = vNegInf;
    vMaxS = vNegInf;
    vMaxL = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi16(s1Len);
    vJLimit = _mm_set1_epi16(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1     = parasail_memalign_int16_t(16, s1Len+PAD);
    s2B    = parasail_memalign_int16_t(16, s2Len+PAD2);
    _H_pr  = parasail_memalign_int16_t(16, s2Len+PAD2);
    _HM_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _HS_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _HL_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _F_pr  = parasail_memalign_int16_t(16, s2Len+PAD2);
    _FM_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _FS_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _FL_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    HM_pr = _HM_pr+PAD;
    HS_pr = _HS_pr+PAD;
    HL_pr = _HL_pr+PAD;
    F_pr = _F_pr+PAD;
    FM_pr = _FM_pr+PAD;
    FS_pr = _FS_pr+PAD;
    FL_pr = _FL_pr+PAD;

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_HM_pr) return NULL;
    if (!_HS_pr) return NULL;
    if (!_HL_pr) return NULL;
    if (!_F_pr) return NULL;
    if (!_FM_pr) return NULL;
    if (!_FS_pr) return NULL;
    if (!_FL_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    /* pad back of s1 with dummy values */
    for (i=s1Len; i<s1Len_PAD; ++i) {
        s1[i] = 0; /* point to first matrix row because we don't care */
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i case1 = vZero;
        __m128i case2 = vZero;
        __m128i case0 = vZero;
        __m128i vNH = vNegInf0;
        __m128i vNM = vZero;
        __m128i vNS = vZero;
        __m128i vNL = vZero;
        __m128i vWH = vNegInf0;
        __m128i vWM = vZero;
        __m128i vWS = vZero;
        __m128i vWL = vZero;
        __m128i vE = vNegInf;
        __m128i vE_opn = vNegInf;
        __m128i vE_ext = vNegInf;
        __m128i vEM = vZero;
        __m128i vES = vZero;
        __m128i vEL = vZero;
        __m128i vF = vNegInf;
        __m128i vF_opn = vNegInf;
        __m128i vF_ext = vNegInf;
        __m128i vFM = vZero;
        __m128i vFS = vZero;
        __m128i vFL = vZero;
        __m128i vJ = vJreset;
        __m128i vs1 = _mm_set_epi16(
                s1[i+0],
                s1[i+1],
                s1[i+2],
                s1[i+3],
                s1[i+4],
                s1[i+5],
                s1[i+6],
                s1[i+7]);
        __m128i vs2 = vNegInf;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        __m128i vIltLimit = _mm_cmplt_epi16(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            __m128i vNWM = vNM;
            __m128i vNWS = vNS;
            __m128i vNWL = vNL;
            vNH = _mm_srli_si128(vWH, 2);
            vNH = _mm_insert_epi16(vNH, H_pr[j], 7);
            vNM = _mm_srli_si128(vWM, 2);
            vNM = _mm_insert_epi16(vNM, HM_pr[j], 7);
            vNS = _mm_srli_si128(vWS, 2);
            vNS = _mm_insert_epi16(vNS, HS_pr[j], 7);
            vNL = _mm_srli_si128(vWL, 2);
            vNL = _mm_insert_epi16(vNL, HL_pr[j], 7);
            vF = _mm_srli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, F_pr[j], 7);
            vFM = _mm_srli_si128(vFM, 2);
            vFM = _mm_insert_epi16(vFM, FM_pr[j], 7);
            vFS = _mm_srli_si128(vFS, 2);
            vFS = _mm_insert_epi16(vFS, FS_pr[j], 7);
            vFL = _mm_srli_si128(vFL, 2);
            vFL = _mm_insert_epi16(vFL, FL_pr[j], 7);
            vF_opn = _mm_subs_epi16(vNH, vOpen);
            vF_ext = _mm_subs_epi16(vF, vGap);
            vF = _mm_max_epi16(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi16(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vNM, case1);
            vFS = _mm_blendv_epi8(vFS, vNS, case1);
            vFL = _mm_blendv_epi8(vFL, vNL, case1);
            vFL = _mm_adds_epi16(vFL, vOne);
            vE_opn = _mm_subs_epi16(vWH, vOpen);
            vE_ext = _mm_subs_epi16(vE, vGap);
            vE = _mm_max_epi16(vE_opn, vE_ext);
            case1 = _mm_cmpgt_epi16(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vWM, case1);
            vES = _mm_blendv_epi8(vES, vWS, case1);
            vEL = _mm_blendv_epi8(vEL, vWL, case1);
            vEL = _mm_adds_epi16(vEL, vOne);
            vs2 = _mm_srli_si128(vs2, 2);
            vs2 = _mm_insert_epi16(vs2, s2[j], 7);
            vMat = _mm_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]]
                    );
            vNWH = _mm_adds_epi16(vNWH, vMat);
            vWH = _mm_max_epi16(vNWH, vE);
            vWH = _mm_max_epi16(vWH, vF);
            vWH = _mm_max_epi16(vWH, vZero);
            case1 = _mm_cmpeq_epi16(vWH, vNWH);
            case2 = _mm_cmpeq_epi16(vWH, vF);
            case0 = _mm_cmpeq_epi16(vWH, vZero);
            vWM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_adds_epi16(vNWM,
                        _mm_and_si128(
                            _mm_cmpeq_epi16(vs1,vs2),
                            vOne)),
                    case1);
            vWM = _mm_blendv_epi8(vWM, vZero, case0);
            vWS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_adds_epi16(vNWS,
                        _mm_and_si128(
                            _mm_cmpgt_epi16(vMat,vZero),
                            vOne)),
                    case1);
            vWS = _mm_blendv_epi8(vWS, vZero, case0);
            vWL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_adds_epi16(vNWL, vOne), case1);
            vWL = _mm_blendv_epi8(vWL, vZero, case0);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm_andnot_si128(cond, vWH);
                vWM = _mm_andnot_si128(cond, vWM);
                vWS = _mm_andnot_si128(cond, vWS);
                vWL = _mm_andnot_si128(cond, vWL);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
                vEM = _mm_andnot_si128(cond, vEM);
                vES = _mm_andnot_si128(cond, vES);
                vEL = _mm_andnot_si128(cond, vEL);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWM);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWS);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWL);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vWH, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vWM, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vWS, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vWL, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->stats->rowcols->score_row,   result->stats->rowcols->score_col, vWH, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->matches_row, result->stats->rowcols->matches_col, vWM, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->similar_row, result->stats->rowcols->similar_col, vWS, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->length_row,  result->stats->rowcols->length_col, vWL, i, s1Len, j, s2Len);
#endif
            H_pr[j-7] = (int16_t)_mm_extract_epi16(vWH,0);
            HM_pr[j-7] = (int16_t)_mm_extract_epi16(vWM,0);
            HS_pr[j-7] = (int16_t)_mm_extract_epi16(vWS,0);
            HL_pr[j-7] = (int16_t)_mm_extract_epi16(vWL,0);
            F_pr[j-7] = (int16_t)_mm_extract_epi16(vF,0);
            FM_pr[j-7] = (int16_t)_mm_extract_epi16(vFM,0);
            FS_pr[j-7] = (int16_t)_mm_extract_epi16(vFS,0);
            FL_pr[j-7] = (int16_t)_mm_extract_epi16(vFL,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m128i cond_valid_J = _mm_and_si128(
                        _mm_cmpgt_epi16(vJ, vNegOne),
                        _mm_cmplt_epi16(vJ, vJLimit));
                __m128i cond_valid_IJ = _mm_and_si128(cond_valid_J, vIltLimit);
                __m128i cond_eq = _mm_cmpeq_epi16(vWH, vMaxH);
                __m128i cond_max = _mm_cmpgt_epi16(vWH, vMaxH);
                __m128i cond_all = _mm_and_si128(cond_max, cond_valid_IJ);
                __m128i cond_Jlt = _mm_cmplt_epi16(vJ, vEndJ);
                vMaxH = _mm_blendv_epi8(vMaxH, vWH, cond_all);
                vMaxM = _mm_blendv_epi8(vMaxM, vWM, cond_all);
                vMaxS = _mm_blendv_epi8(vMaxS, vWS, cond_all);
                vMaxL = _mm_blendv_epi8(vMaxL, vWL, cond_all);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all);
                cond_all = _mm_and_si128(cond_Jlt, cond_eq);
                cond_all = _mm_and_si128(cond_all, cond_valid_IJ);
                vMaxM = _mm_blendv_epi8(vMaxM, vWM, cond_all);
                vMaxS = _mm_blendv_epi8(vMaxS, vWS, cond_all);
                vMaxL = _mm_blendv_epi8(vMaxL, vWL, cond_all);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all);
            }
            vJ = _mm_adds_epi16(vJ, vOne);
        }
        vI = _mm_adds_epi16(vI, vN);
    }

    /* alignment ending position */
    {
        int16_t *t = (int16_t*)&vMaxH;
        int16_t *m = (int16_t*)&vMaxM;
        int16_t *s = (int16_t*)&vMaxS;
        int16_t *l = (int16_t*)&vMaxL;
        int16_t *i = (int16_t*)&vEndI;
        int16_t *j = (int16_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++m, ++s, ++l, ++i, ++j) {
            if (*t > score) {
                score = *t;
                matches = *m;
                similar = *s;
                length = *l;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    matches = *m;
                    similar = *s;
                    length = *l;
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    matches = *m;
                    similar = *s;
                    length = *l;
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(_FL_pr);
    parasail_free(_FS_pr);
    parasail_free(_FM_pr);
    parasail_free(_F_pr);
    parasail_free(_HL_pr);
    parasail_free(_HS_pr);
    parasail_free(_HM_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    parasail_free(s1);

    return result;
}